

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_truncated.c
# Opt level: O2

void test_read_truncated(void)

{
  int iVar1;
  archive *paVar2;
  archive_entry *entry;
  la_ssize_t lVar3;
  char *pcVar4;
  longlong v1;
  uint uVar5;
  ulong uVar6;
  wchar_t wVar7;
  longlong lVar8;
  char *pcVar9;
  size_t used;
  archive_entry *ae;
  
  paVar2 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                   ,L'&',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar2);
  iVar1 = archive_write_add_filter_none(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar2);
  iVar1 = archive_write_open_memory(paVar2,buff,1000000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar2);
  entry = archive_entry_new();
  ae = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                   ,L'.',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81ed);
  fill_with_pseudorandom_data(buff2,100000);
  archive_entry_set_size(entry,100000);
  iVar1 = archive_write_header(paVar2,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar2);
  archive_entry_free(entry);
  lVar3 = archive_write_data(paVar2,buff2,100000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'5',100000,"sizeof(buff2)",lVar3,
                      "archive_write_data(a, buff2, sizeof(buff2))",paVar2);
  iVar1 = archive_write_close(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar2);
  iVar1 = archive_write_free(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  uVar6 = 1;
  while( true ) {
    if (used + 100 <= uVar6) break;
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                     ,L'>',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar2
                       );
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar2
                       );
    iVar1 = archive_read_open_memory(paVar2,buff,uVar6);
    uVar5 = (uint)uVar6;
    if (uVar5 < 0x200) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'B',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                          "archive_read_open_memory(a, buff, i)",paVar2);
    }
    else {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, i)",
                          paVar2);
      iVar1 = archive_read_next_header(paVar2,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar2
                         );
      lVar3 = archive_read_data(paVar2,buff2,100000);
      if (uVar5 < 0x188a0) {
        wVar7 = L'J';
        lVar8 = -0x1e;
        pcVar4 = "ARCHIVE_FATAL";
        pcVar9 = "archive_read_data(a, buff2, sizeof(buff2))";
      }
      else {
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                            ,L'M',100000,"sizeof(buff2)",lVar3,
                            "archive_read_data(a, buff2, sizeof(buff2))",paVar2);
        iVar1 = archive_read_next_header(paVar2,&ae);
        lVar3 = (la_ssize_t)iVar1;
        if (uVar5 < 0x18c00) {
          wVar7 = L'W';
          lVar8 = -0x1e;
          pcVar4 = "ARCHIVE_FATAL";
        }
        else {
          wVar7 = L'Y';
          lVar8 = 1;
          pcVar4 = "ARCHIVE_EOF";
        }
        pcVar9 = "archive_read_next_header(a, &ae)";
      }
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,wVar7,lVar8,pcVar4,lVar3,pcVar9,paVar2);
    }
    iVar1 = archive_read_close(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar2);
    iVar1 = archive_read_free(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    uVar6 = (ulong)(uVar5 + 100);
  }
  uVar6 = 1;
  while (uVar6 < used + 100) {
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                     ,L'd',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar2
                       );
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar2
                       );
    iVar1 = archive_read_open_memory(paVar2,buff,uVar6);
    uVar5 = (uint)uVar6;
    if (uVar5 < 0x200) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'h',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                          "archive_read_open_memory(a, buff, i)",paVar2);
    }
    else {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, i)",
                          paVar2);
      iVar1 = archive_read_next_header(paVar2,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar2
                         );
      iVar1 = archive_read_data_skip(paVar2);
      lVar8 = (longlong)iVar1;
      if (uVar5 < 0x18a00) {
        wVar7 = L'p';
        v1 = -0x1e;
        pcVar4 = "ARCHIVE_FATAL";
        pcVar9 = "archive_read_data_skip(a)";
      }
      else {
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                            ,L's',0,"ARCHIVE_OK",lVar8,"archive_read_data_skip(a)",paVar2);
        iVar1 = archive_read_next_header(paVar2,&ae);
        lVar8 = (longlong)iVar1;
        if (uVar5 < 0x18c00) {
          wVar7 = L'}';
          v1 = -0x1e;
          pcVar4 = "ARCHIVE_FATAL";
        }
        else {
          wVar7 = L'\x7f';
          v1 = 1;
          pcVar4 = "ARCHIVE_EOF";
        }
        pcVar9 = "archive_read_next_header(a, &ae)";
      }
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,wVar7,v1,pcVar4,lVar8,pcVar9,paVar2);
    }
    iVar1 = archive_read_close(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar2);
    iVar1 = archive_read_free(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    uVar6 = (ulong)(uVar5 + 100);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_truncated)
{
	struct archive_entry *ae;
	struct archive *a;
	unsigned int i;
	size_t used;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	fill_with_pseudorandom_data(buff2, sizeof(buff2));
	archive_entry_set_size(ae, sizeof(buff2));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, sizeof(buff2), archive_write_data(a, buff2, sizeof(buff2)));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Now, read back a truncated version of the archive and
	 * verify that we get an appropriate error. */
	for (i = 1; i < used + 100; i += 100) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		if (i < 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_open_memory(a, buff, i));
			goto wrap_up;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, i));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

		if (i < 512 + sizeof(buff2)) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data(a, buff2, sizeof(buff2)));
			goto wrap_up;
		} else {
			assertEqualIntA(a, sizeof(buff2), archive_read_data(a, buff2, sizeof(buff2)));
		}

		/* Verify the end of the archive. */
		/* Archive must be long enough to capture a 512-byte
		 * block of zeroes after the entry.  (POSIX requires a
		 * second block of zeros to be written but libarchive
		 * does not return an error if it can't consume
		 * it.) */
		if (i < 512 + 512*((sizeof(buff2) + 511)/512) + 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
		} else {
			assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
		}
	wrap_up:
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}



	/* Same as above, except skip the body instead of reading it. */
	for (i = 1; i < used + 100; i += 100) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		if (i < 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_open_memory(a, buff, i));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, i));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

		if (i < 512 + 512*((sizeof(buff2)+511)/512)) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data_skip(a));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		}

		/* Verify the end of the archive. */
		/* Archive must be long enough to capture a 512-byte
		 * block of zeroes after the entry.  (POSIX requires a
		 * second block of zeros to be written but libarchive
		 * does not return an error if it can't consume
		 * it.) */
		if (i < 512 + 512*((sizeof(buff2) + 511)/512) + 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
		} else {
			assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
		}
	wrap_up2:
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
}